

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::Init(CInput *this)

{
  int iVar1;
  IEngineGraphics *pIVar2;
  IConfigManager *pIVar3;
  undefined4 extraout_var;
  IConsole *pIVar4;
  IInterface *in_RDI;
  CInput *in_stack_00000030;
  
  (*in_RDI->_vptr_IInterface[0x10])();
  IInterface::Kernel(in_RDI);
  pIVar2 = IKernel::RequestInterface<IEngineGraphics>((IKernel *)in_RDI);
  in_RDI[0x121].m_pKernel = (IKernel *)pIVar2;
  IInterface::Kernel(in_RDI);
  pIVar3 = IKernel::RequestInterface<IConfigManager>((IKernel *)in_RDI);
  iVar1 = (*(pIVar3->super_IInterface)._vptr_IInterface[6])();
  in_RDI[0x122]._vptr_IInterface = (_func_int **)CONCAT44(extraout_var,iVar1);
  IInterface::Kernel(in_RDI);
  pIVar4 = IKernel::RequestInterface<IConsole>((IKernel *)in_RDI);
  in_RDI[0x122].m_pKernel = (IKernel *)pIVar4;
  (*in_RDI->_vptr_IInterface[9])();
  InitJoysticks(in_stack_00000030);
  return;
}

Assistant:

void CInput::Init()
{
	StopTextInput();

	m_pGraphics = Kernel()->RequestInterface<IEngineGraphics>();
	m_pConfig = Kernel()->RequestInterface<IConfigManager>()->Values();
	m_pConsole = Kernel()->RequestInterface<IConsole>();

	MouseModeRelative();

	InitJoysticks();
}